

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

ULONGLONG CalcFileNameHash(char *szFileName)

{
  uchar *puVar1;
  char cVar2;
  size_t length;
  ulong uVar3;
  uint32_t dwHashLow;
  uint32_t dwHashHigh;
  char szNormName [1025];
  uint32_t local_420;
  uint32_t local_41c;
  uchar local_418 [1032];
  
  cVar2 = *szFileName;
  if (cVar2 == '\0') {
    puVar1 = local_418;
    length = 0;
  }
  else {
    length = 0;
    do {
      uVar3 = length;
      length = uVar3 + 1;
      local_418[uVar3] = AsciiToUpperTable_BkSlash[cVar2];
      if (0x3fe < uVar3) break;
      cVar2 = szFileName[uVar3 + 1];
    } while (cVar2 != '\0');
    puVar1 = local_418 + uVar3 + 1;
  }
  *puVar1 = '\0';
  local_41c = 0;
  local_420 = 0;
  hashlittle2(local_418,length,&local_41c,&local_420);
  return CONCAT44(local_41c,local_420);
}

Assistant:

size_t NormalizeFileName(const unsigned char * NormTable, char * szNormName, const char * szFileName, size_t cchMaxChars)
{
    char * szNormNameEnd = szNormName + cchMaxChars;
    size_t i;

    // Normalize the file name: ToLower + BackSlashToSlash
    for(i = 0; szFileName[0] != 0 && szNormName < szNormNameEnd; i++)
        *szNormName++ = NormTable[*szFileName++];

    // Terminate the string
    szNormName[0] = 0;
    return i;
}